

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O0

void __thiscall
gl4cts::StencilTexturing::FunctionalTest::prepareSourceTextureData
          (FunctionalTest *this,GLenum internal_format,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *texture_data)

{
  TestError *pTVar1;
  long lVar2;
  reference pvVar3;
  float *pfVar4;
  float fVar5;
  GLubyte *stencil_data;
  GLubyte *pixel_data;
  GLubyte *depth_i_data;
  GLubyte *depth_f_data;
  GLuint stencil;
  GLuint stencil_h;
  GLuint pixel_offset;
  GLuint depth_i;
  GLfloat depth_f;
  GLfloat depth_h;
  GLuint x;
  GLuint stencil_v;
  GLuint line_offset;
  GLfloat depth_v;
  GLuint y;
  GLuint texture_size;
  GLuint line_size;
  GLuint pixel_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *texture_data_local;
  GLenum internal_format_local;
  FunctionalTest *this_local;
  
  if (internal_format == 0x88f0) {
    texture_size = 4;
  }
  else {
    if (internal_format != 0x8cad) {
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                 ,0x403);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    texture_size = 8;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (texture_data,(ulong)(texture_size << 6));
  line_offset = 0;
  do {
    if (7 < line_offset) {
      return;
    }
    for (depth_f = 0.0; (uint)depth_f < 8; depth_f = (GLfloat)((int)depth_f + 1)) {
      fVar5 = (float)(uint)depth_f * -0.071428575 + 1.0 + (float)line_offset * -0.071428575;
      lVar2 = (long)(fVar5 * 16777215.0);
      depth_f_data._0_1_ = SUB41(depth_f,0) + '\x01' + (char)line_offset;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (texture_data,0);
      pfVar4 = (float *)(pvVar3 + (ulong)(texture_size * (int)depth_f) +
                                  (ulong)(texture_size * 8 * line_offset));
      if (texture_size == 4) {
        *(value_type *)pfVar4 = (value_type)depth_f_data;
        stencil_h._0_2_ = (undefined2)lVar2;
        *(undefined2 *)((long)pfVar4 + 1) = (undefined2)stencil_h;
        stencil_h._2_1_ = (value_type)((ulong)lVar2 >> 0x10);
        *(value_type *)((long)pfVar4 + 3) = stencil_h._2_1_;
      }
      else {
        if (texture_size != 8) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"Invalid value",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                     ,0x42d);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        *pfVar4 = fVar5;
        *(value_type *)(pfVar4 + 1) = (value_type)depth_f_data;
      }
    }
    line_offset = line_offset + 1;
  } while( true );
}

Assistant:

void FunctionalTest::prepareSourceTextureData(GLenum internal_format, std::vector<GLubyte>& texture_data)
{
	static const GLfloat depth_step_h   = -0.5f / ((GLfloat)(m_width - 1));
	static const GLfloat depth_step_v   = -0.5f / ((GLfloat)(m_height - 1));
	static const GLuint  stencil_step_h = 1;
	static const GLuint  stencil_step_v = 1;
	static const GLuint  n_pixels		= m_width * m_height;
	GLuint				 pixel_size		= 0;
	GLuint				 line_size		= 0;
	GLuint				 texture_size   = 0;

	/* Select size of pixel */
	switch (internal_format)
	{
	case GL_DEPTH24_STENCIL8:
		pixel_size = 4;
		break;
	case GL_DEPTH32F_STENCIL8:
		pixel_size = 8;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	line_size	= pixel_size * m_width;
	texture_size = pixel_size * n_pixels;

	/* Allocate storage */
	texture_data.resize(texture_size);

	/* Fill texture data */
	for (GLuint y = 0; y < m_height; ++y)
	{
		const GLfloat depth_v	 = depth_step_v * (GLfloat)y;
		const GLuint  line_offset = line_size * y;
		const GLuint  stencil_v   = stencil_step_v * y;

		for (GLuint x = 0; x < m_width; ++x)
		{
			const GLfloat depth_h	  = depth_step_h * (GLfloat)x;
			const GLfloat depth_f	  = 1 + depth_h + depth_v;
			const GLuint  depth_i	  = (GLuint)(((GLfloat)0xffffff) * depth_f);
			const GLuint  pixel_offset = pixel_size * x;
			const GLuint  stencil_h	= stencil_step_h * x;
			const GLuint  stencil	  = 1 + stencil_h + stencil_v;

			GLubyte* depth_f_data = (GLubyte*)&depth_f;
			GLubyte* depth_i_data = (GLubyte*)&depth_i;
			GLubyte* pixel_data   = &texture_data[0] + line_offset + pixel_offset;
			GLubyte* stencil_data = (GLubyte*)&stencil;

			switch (pixel_size)
			{
			case 4:
				memcpy(pixel_data, stencil_data, 1);
				memcpy(pixel_data + 1, depth_i_data, 3);
				break;
			case 8:
				memcpy(pixel_data, depth_f_data, 4);
				memcpy(pixel_data + 4, stencil_data, 1);
				break;
			default:
				TCU_FAIL("Invalid value");
				break;
			}
		}
	}
}